

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O2

dynamic_string * __thiscall crnlib::dynamic_string::left(dynamic_string *this,uint len)

{
  dynamic_string *pdVar1;
  
  pdVar1 = substring(this,0,len);
  return pdVar1;
}

Assistant:

dynamic_string& dynamic_string::left(uint len) {
  return substring(0, len);
}